

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void AddVisibilityCompileOption
               (string *flags,cmGeneratorTarget *target,cmLocalGenerator *lg,string *lang,
               string *warnCMP0063)

{
  bool bVar1;
  cmMakefile *this;
  string *psVar2;
  ostream *poVar3;
  string *__rhs;
  undefined1 local_2b0 [8];
  string option;
  undefined1 local_270 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  cmValue local_b8;
  cmValue prop;
  string flagDefine;
  cmValue local_88;
  cmValue opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string compileOption;
  string *warnCMP0063_local;
  string *lang_local;
  cmLocalGenerator *lg_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  
  compileOption.field_2._8_8_ = warnCMP0063;
  std::operator+(&local_70,"CMAKE_",lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,"_COMPILE_OPTIONS_VISIBILITY");
  std::__cxx11::string::~string((string *)&local_70);
  this = cmLocalGenerator::GetMakefile(lg);
  local_88 = cmMakefile::GetDefinition(this,(string *)local_50);
  bVar1 = cmValue::operator_cast_to_bool(&local_88);
  if (!bVar1) goto LAB_003da619;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop,lang,
                 "_VISIBILITY_PRESET");
  local_b8 = cmGeneratorTarget::GetProperty(target,(string *)&prop);
  bVar1 = cmValue::operator_cast_to_bool(&local_b8);
  if (bVar1) {
    if (compileOption.field_2._8_8_ == 0) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_b8);
      bVar1 = std::operator!=(psVar2,"hidden");
      if (bVar1) {
        psVar2 = cmValue::operator*[abi_cxx11_(&local_b8);
        bVar1 = std::operator!=(psVar2,"default");
        if (bVar1) {
          psVar2 = cmValue::operator*[abi_cxx11_(&local_b8);
          bVar1 = std::operator!=(psVar2,"protected");
          if (bVar1) {
            psVar2 = cmValue::operator*[abi_cxx11_(&local_b8);
            bVar1 = std::operator!=(psVar2,"internal");
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
              poVar3 = std::operator<<((ostream *)local_270,"Target ");
              psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
              poVar3 = std::operator<<(poVar3,(string *)psVar2);
              poVar3 = std::operator<<(poVar3," uses unsupported value \"");
              psVar2 = cmValue::operator*[abi_cxx11_(&local_b8);
              poVar3 = std::operator<<(poVar3,(string *)psVar2);
              poVar3 = std::operator<<(poVar3,"\" for ");
              poVar3 = std::operator<<(poVar3,(string *)&prop);
              poVar3 = std::operator<<(poVar3,".");
              std::operator<<(poVar3,
                              " The supported values are: default, hidden, protected, and internal."
                             );
              std::__cxx11::ostringstream::str();
              cmSystemTools::Error((string *)((long)&option.field_2 + 8));
              std::__cxx11::string::~string((string *)(option.field_2._M_local_buf + 8));
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
              goto LAB_003da60d;
            }
          }
        }
      }
      psVar2 = cmValue::operator*[abi_cxx11_(&local_88);
      __rhs = cmValue::operator*[abi_cxx11_(&local_b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     psVar2,__rhs);
      (*lg->_vptr_cmLocalGenerator[6])(lg,flags,local_2b0);
      std::__cxx11::string::~string((string *)local_2b0);
    }
    else {
      std::operator+(&local_f8,"  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop);
      std::operator+(&local_d8,&local_f8,"\n");
      std::__cxx11::string::operator+=((string *)compileOption.field_2._8_8_,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
  }
LAB_003da60d:
  std::__cxx11::string::~string((string *)&prop);
LAB_003da619:
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

static void AddVisibilityCompileOption(std::string& flags,
                                       cmGeneratorTarget const* target,
                                       cmLocalGenerator* lg,
                                       const std::string& lang,
                                       std::string* warnCMP0063)
{
  std::string compileOption = "CMAKE_" + lang + "_COMPILE_OPTIONS_VISIBILITY";
  cmValue opt = lg->GetMakefile()->GetDefinition(compileOption);
  if (!opt) {
    return;
  }
  std::string flagDefine = lang + "_VISIBILITY_PRESET";

  cmValue prop = target->GetProperty(flagDefine);
  if (!prop) {
    return;
  }
  if (warnCMP0063) {
    *warnCMP0063 += "  " + flagDefine + "\n";
    return;
  }
  if ((*prop != "hidden") && (*prop != "default") && (*prop != "protected") &&
      (*prop != "internal")) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " uses unsupported value \""
      << *prop << "\" for " << flagDefine << "."
      << " The supported values are: default, hidden, protected, and "
         "internal.";
    cmSystemTools::Error(e.str());
    return;
  }
  std::string option = *opt + *prop;
  lg->AppendFlags(flags, option);
}